

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_ave_s_h_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t fVar2;
  fpr_t fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  fVar2 = (env->active_fpu).fpr[ws];
  fVar3 = (env->active_fpu).fpr[wt];
  auVar6 = psraw((undefined1  [16])fVar2,1);
  auVar5 = psraw((undefined1  [16])fVar3,1);
  auVar4 = (undefined1  [16])fVar2 & (undefined1  [16])fVar3 & _DAT_00d836c0;
  pfVar1 = (env->active_fpu).fpr + wd;
  *(short *)pfVar1 = auVar4._0_2_ + auVar5._0_2_ + auVar6._0_2_;
  *(short *)((long)pfVar1 + 2) = auVar4._2_2_ + auVar5._2_2_ + auVar6._2_2_;
  *(short *)((long)pfVar1 + 4) = auVar4._4_2_ + auVar5._4_2_ + auVar6._4_2_;
  *(short *)((long)pfVar1 + 6) = auVar4._6_2_ + auVar5._6_2_ + auVar6._6_2_;
  *(short *)((long)pfVar1 + 8) = auVar4._8_2_ + auVar5._8_2_ + auVar6._8_2_;
  *(short *)((long)pfVar1 + 10) = auVar4._10_2_ + auVar5._10_2_ + auVar6._10_2_;
  *(short *)((long)pfVar1 + 0xc) = auVar4._12_2_ + auVar5._12_2_ + auVar6._12_2_;
  *(short *)((long)pfVar1 + 0xe) = auVar4._14_2_ + auVar5._14_2_ + auVar6._14_2_;
  return;
}

Assistant:

void helper_msa_ave_s_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_ave_s_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_ave_s_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_ave_s_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_ave_s_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_ave_s_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_ave_s_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_ave_s_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_ave_s_df(DF_HALF, pws->h[7],  pwt->h[7]);
}